

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O2

REF_STATUS ref_mpi_front_comm(REF_MPI ref_mpi,REF_MPI *split_mpi_ptr,REF_INT n)

{
  uint uVar1;
  
  uVar1 = ref_mpi_create_from_comm(split_mpi_ptr,split_mpi_ptr);
  if (uVar1 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0xa8,
           "ref_mpi_front_comm",(ulong)uVar1,"create from NULL comm");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_front_comm(REF_MPI ref_mpi, REF_MPI *split_mpi_ptr,
                                      REF_INT n) {
#ifdef HAVE_MPI
  MPI_Comm split_comm;
  int color, rank;
  rank = ref_mpi_rank(ref_mpi);
  if (rank < n) {
    color = 0;
  } else {
    color = 1;
  }
  MPI_Comm_split(ref_mpi_comm(ref_mpi), color, rank, &split_comm);
  RSS(ref_mpi_create_from_comm(split_mpi_ptr, &split_comm), "split comm");
#else
  SUPRESS_UNUSED_COMPILER_WARNING(ref_mpi);
  RSS(ref_mpi_create_from_comm(split_mpi_ptr, NULL), "create from NULL comm");
  SUPRESS_UNUSED_COMPILER_WARNING(n);
#endif

  return REF_SUCCESS;
}